

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonlinear_beamformer.cc
# Opt level: O0

void __thiscall
webrtc::NonlinearBeamformer::NonlinearBeamformer
          (NonlinearBeamformer *this,
          vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
          *array_geometry,SphericalPointf target_direction)

{
  size_type sVar1;
  float *pfVar2;
  float fVar3;
  Optional<webrtc::CartesianPoint<float>_> OVar4;
  vector<float,_std::allocator<float>_> *local_1a0;
  vector<std::unique_ptr<webrtc::ComplexMatrix<float>,_std::default_delete<webrtc::ComplexMatrix<float>_>_>,_std::allocator<std::unique_ptr<webrtc::ComplexMatrix<float>,_std::default_delete<webrtc::ComplexMatrix<float>_>_>_>_>
  *local_180;
  ComplexMatrixF *local_160;
  ComplexMatrixF *local_140;
  ComplexMatrixF *local_120;
  ComplexMatrixF *local_100;
  float local_78;
  float local_74;
  undefined5 local_70;
  undefined3 uStack_6b;
  undefined5 local_68;
  undefined3 uStack_63;
  vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_> local_50;
  vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_> *local_38;
  vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
  *array_geometry_local;
  NonlinearBeamformer *this_local;
  float local_20;
  NonlinearBeamformer *local_18;
  SphericalPointf target_direction_local;
  
  local_20 = target_direction.s[2];
  this_local = target_direction.s._0_8_;
  local_38 = array_geometry;
  array_geometry_local =
       (vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_> *)
       this;
  local_18 = this_local;
  target_direction_local.s[0] = local_20;
  Beamformer<float>::Beamformer(&this->super_Beamformer<float>);
  LappedTransform::Callback::Callback(&this->super_Callback);
  (this->super_Beamformer<float>)._vptr_Beamformer =
       (_func_int **)&PTR__NonlinearBeamformer_002fc0c8;
  (this->super_Callback)._vptr_Callback = (_func_int **)&PTR__NonlinearBeamformer_002fc118;
  std::unique_ptr<webrtc::LappedTransform,std::default_delete<webrtc::LappedTransform>>::
  unique_ptr<std::default_delete<webrtc::LappedTransform>,void>
            ((unique_ptr<webrtc::LappedTransform,std::default_delete<webrtc::LappedTransform>> *)
             &this->lapped_transform_);
  sVar1 = std::
          vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>::
          size(local_38);
  this->num_input_channels_ = sVar1;
  std::vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>::
  vector(&local_50,local_38);
  anon_unknown_9::GetCenteredArray(&this->array_geometry_,&local_50);
  std::vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>::
  ~vector(&local_50);
  OVar4 = GetArrayNormalIfExists(local_38);
  local_70 = OVar4.value_.c._0_5_;
  uStack_6b = OVar4.value_.c[1]._1_3_;
  local_68 = OVar4._8_5_;
  uStack_63 = OVar4._13_3_;
  *(long *)((long)(this->array_normal_).value_.c + 5) = OVar4._5_8_;
  *(long *)(this->array_normal_).value_.c = OVar4.value_.c._0_8_;
  fVar3 = GetMinimumSpacing(local_38);
  this->min_mic_spacing_ = fVar3;
  fVar3 = SphericalPoint<float>::azimuth((SphericalPoint<float> *)&local_18);
  this->target_angle_radians_ = fVar3;
  std::vector<float,_std::allocator<float>_>::vector(&this->interf_angles_radians_);
  local_74 = 3.1415927;
  local_78 = 0.025132744 / this->min_mic_spacing_;
  pfVar2 = std::max<float>((float *)&(anonymous_namespace)::kMinAwayRadians,&local_78);
  pfVar2 = std::min<float>(&local_74,pfVar2);
  this->away_radians_ = *pfVar2;
  local_100 = this->delay_sum_masks_;
  do {
    ComplexMatrix<float>::ComplexMatrix(local_100);
    local_100 = local_100 + 1;
  } while (local_100 != this->normalized_delay_sum_masks_);
  local_120 = this->normalized_delay_sum_masks_;
  do {
    ComplexMatrix<float>::ComplexMatrix(local_120);
    local_120 = local_120 + 1;
  } while (local_120 != this->target_cov_mats_);
  local_140 = this->target_cov_mats_;
  do {
    ComplexMatrix<float>::ComplexMatrix(local_140);
    local_140 = local_140 + 1;
  } while (local_140 != this->uniform_cov_mat_);
  local_160 = this->uniform_cov_mat_;
  do {
    ComplexMatrix<float>::ComplexMatrix(local_160);
    local_160 = local_160 + 1;
  } while (local_160 != (ComplexMatrixF *)this->interf_cov_mats_);
  local_180 = this->interf_cov_mats_;
  do {
    std::
    vector<std::unique_ptr<webrtc::ComplexMatrix<float>,_std::default_delete<webrtc::ComplexMatrix<float>_>_>,_std::allocator<std::unique_ptr<webrtc::ComplexMatrix<float>,_std::default_delete<webrtc::ComplexMatrix<float>_>_>_>_>
    ::vector(local_180);
    local_180 = local_180 + 1;
  } while (local_180 !=
           (vector<std::unique_ptr<webrtc::ComplexMatrix<float>,_std::default_delete<webrtc::ComplexMatrix<float>_>_>,_std::allocator<std::unique_ptr<webrtc::ComplexMatrix<float>,_std::default_delete<webrtc::ComplexMatrix<float>_>_>_>_>
            *)this->wave_numbers_);
  local_1a0 = this->rpsiws_;
  do {
    std::vector<float,_std::allocator<float>_>::vector(local_1a0);
    local_1a0 = local_1a0 + 1;
  } while ((ComplexMatrixF *)local_1a0 != &this->eig_m_);
  ComplexMatrix<float>::ComplexMatrix(&this->eig_m_);
  WindowGenerator::KaiserBesselDerived(1.5,0x100,this->window_);
  return;
}

Assistant:

NonlinearBeamformer::NonlinearBeamformer(
    const std::vector<Point>& array_geometry,
    SphericalPointf target_direction)
    : num_input_channels_(array_geometry.size()),
      array_geometry_(GetCenteredArray(array_geometry)),
      array_normal_(GetArrayNormalIfExists(array_geometry)),
      min_mic_spacing_(GetMinimumSpacing(array_geometry)),
      target_angle_radians_(target_direction.azimuth()),
      away_radians_(std::min(
          static_cast<float>(M_PI),
          std::max(kMinAwayRadians,
                   kAwaySlope * static_cast<float>(M_PI) / min_mic_spacing_))) {
  WindowGenerator::KaiserBesselDerived(kKbdAlpha, kFftSize, window_);
}